

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<float>::BpTree(BpTree<float> *this,string *IndexFileName)

{
  int iVar1;
  char *local_60;
  char *p;
  int local_38;
  int BlockNum;
  value_type_conflict local_24;
  int local_20;
  int n;
  int s;
  int i;
  string *IndexFileName_local;
  BpTree<float> *this_local;
  
  _s = IndexFileName;
  IndexFileName_local = (string *)this;
  std::__cxx11::string::string((string *)&this->Index_FileName);
  std::vector<int,_std::allocator<int>_>::vector(&this->FileOff_bin);
  std::__cxx11::string::operator=((string *)&this->Index_FileName,(string *)IndexFileName);
  std::__cxx11::string::string((string *)&p,(string *)IndexFileName);
  iVar1 = Buffer::Allocate(&blocks,(string *)&p,0);
  std::__cxx11::string::~string((string *)&p);
  this->Data_Type = blocks.buffer[iVar1].data[0];
  this->N = *(int *)(blocks.buffer[iVar1].data + 1);
  (this->RootAddr).FileOff = *(int *)(blocks.buffer[iVar1].data + 5);
  this->Current_Off = *(int *)(blocks.buffer[iVar1].data + 9);
  local_20 = *(int *)(blocks.buffer[iVar1].data + 0xd);
  local_60 = blocks.buffer[iVar1].data + 0x11;
  local_38 = iVar1;
  for (n = 0; n < local_20; n = n + 1) {
    local_24 = *(value_type_conflict *)local_60;
    local_60 = local_60 + 4;
    std::vector<int,_std::allocator<int>_>::push_back(&this->FileOff_bin,&local_24);
  }
  return;
}

Assistant:

BpTree<K>::BpTree(string IndexFileName) {
	int i, s, n;
	this->Index_FileName = IndexFileName;
	int BlockNum = blocks.Allocate(IndexFileName, 0);
	char* p = blocks.buffer[BlockNum].data;
	memcpy(&this->Data_Type, p, sizeof(char));
	p += sizeof(char);
	memcpy(&this->N, p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&this->RootAddr.FileOff), p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&this->Current_Off), p, sizeof(int));
	p += sizeof(int);
	memcpy(reinterpret_cast<char*>(&s), p, sizeof(int));
	p += sizeof(int);
	for (i = 0; i < s; i++) {
		memcpy(reinterpret_cast<char*>(&n), p, sizeof(int));
		p += sizeof(int);
		this->FileOff_bin.push_back(n);
	}
}